

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumValueOptions::MergeFrom(EnumValueOptions *this,EnumValueOptions *from)

{
  bool bVar1;
  void *pvVar2;
  Rep *pRVar3;
  void **our_elems;
  int iVar4;
  
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  iVar4 = (from->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    pRVar3 = (from->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar4);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
              (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,our_elems,pRVar3->elements,
               iVar4,((this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_)->allocated_size
                     - (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
    iVar4 = iVar4 + (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
    (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4;
    pRVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar3->allocated_size < iVar4) {
      pRVar3->allocated_size = iVar4;
    }
  }
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    bVar1 = from->deprecated_;
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | 1;
    this->deprecated_ = bVar1;
  }
  return;
}

Assistant:

void EnumValueOptions::MergeFrom(const EnumValueOptions& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueOptions)
  GOOGLE_DCHECK_NE(&from, this);
  _extensions_.MergeFrom(from._extensions_);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  if (from._internal_has_deprecated()) {
    _internal_set_deprecated(from._internal_deprecated());
  }
}